

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Edge(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  uint local_54;
  uint local_50;
  int fVerbose;
  int fDynamic;
  int fMapping;
  int fUseOld;
  int fUsePack;
  int fReverse;
  int nEdges;
  int nFanouts;
  int DelayMax;
  int nBTLimit;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  nFanouts = 0;
  nEdges = 0;
  fReverse = 0;
  fUsePack = 1;
  bVar4 = false;
  bVar2 = false;
  bVar3 = false;
  bVar1 = false;
  local_50 = 1;
  local_54 = 0;
  Extra_UtilGetoptReset();
LAB_002b5450:
  do {
    iVar5 = Extra_UtilGetopt(argc,argv,"CDFErpomdvh");
    if (iVar5 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Empty GIA network.\n");
        return 1;
      }
      if (bVar1) {
        Sle_ManExplore(pAbc->pGia,nFanouts,nEdges,local_50,(uint)(fUsePack == 2),local_54);
        return 0;
      }
      iVar5 = Gia_ManHasMapping(pAbc->pGia);
      if (iVar5 == 0) {
        Abc_Print(-1,"Current AIG has no mapping. Run \"&if\".\n");
        return 1;
      }
      iVar5 = Gia_ManLutSizeMax(pAbc->pGia);
      if (6 < iVar5) {
        uVar6 = Gia_ManLutSizeMax(pAbc->pGia);
        Abc_Print(0,"Current AIG has mapping into %d-LUTs.\n",(ulong)uVar6);
        return 0;
      }
      if (bVar2) {
        if (pAbc->pGia->vPacking == (Vec_Int_t *)0x0) {
          Abc_Print(-1,"Packing information is not present.\n");
          return 0;
        }
        Gia_ManConvertPackingToEdges(pAbc->pGia);
        return 0;
      }
      if (!bVar3) {
        Seg_ManComputeDelay(pAbc->pGia,nEdges,fReverse,(uint)(fUsePack == 2),local_54);
        return 0;
      }
      if ((pAbc->pGia->pManTime != (void *)0x0) && (bVar4)) {
        Abc_Print(0,"Reverse computation does not work when boxes are present.\n");
        return 0;
      }
      if (bVar4) {
        Gia_ManComputeEdgeDelay2(pAbc->pGia);
      }
      else {
        Gia_ManComputeEdgeDelay(pAbc->pGia,(uint)(fUsePack == 2));
      }
      return 0;
    }
    switch(iVar5) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by a positive integer.\n");
        goto LAB_002b585d;
      }
      nFanouts = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      break;
    case 0x44:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by a positive integer.\n");
        goto LAB_002b585d;
      }
      nEdges = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      break;
    case 0x45:
      if (globalUtilOptind < argc) goto LAB_002b55cc;
      Abc_Print(-1,"Command line switch \"-E\" should be followed by a positive integer.\n");
      goto LAB_002b585d;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by a positive integer.\n");
        goto LAB_002b585d;
      }
      fReverse = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      break;
    case 100:
      local_50 = local_50 ^ 1;
      break;
    case 0x68:
    default:
      goto LAB_002b585d;
    case 0x6d:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x6f:
      bVar3 = (bool)(bVar3 ^ 1);
      break;
    case 0x70:
      bVar2 = (bool)(bVar2 ^ 1);
      break;
    case 0x72:
      bVar4 = (bool)(bVar4 ^ 1);
      break;
    case 0x76:
      local_54 = local_54 ^ 1;
    }
  } while( true );
LAB_002b55cc:
  fUsePack = atoi(argv[globalUtilOptind]);
  globalUtilOptind = globalUtilOptind + 1;
  if ((fUsePack != 1) && (fUsePack != 2)) {
    Abc_Print(-1,"Edge limit (%d) should be 1 or 2.\n",(ulong)(uint)fUsePack);
LAB_002b585d:
    Abc_Print(-2,"usage: &edge [-CDFE num] [-rpomdvh]\n");
    Abc_Print(-2,"\t           find edge assignment of the LUT-mapped network\n");
    Abc_Print(-2,"\t-C num   : the SAT solver conflict limit (0 = unused) [default = %d]\n",
              (ulong)(uint)nFanouts);
    Abc_Print(-2,"\t-D num   : the upper bound on delay [default = %d]\n",(ulong)(uint)nEdges);
    Abc_Print(-2,"\t-F num   : skip using edge if fanout higher than this [default = %d]\n",
              (ulong)(uint)fReverse);
    Abc_Print(-2,"\t-E num   : the limit on the number of edges (1 <= num <= 2) [default = %d]\n",
              (ulong)(uint)fUsePack);
    pcVar7 = "no";
    if (bVar4) {
      pcVar7 = "yes";
    }
    Abc_Print(-2,"\t-r       : toggles using reverse order [default = %s]\n",pcVar7);
    pcVar7 = "no";
    if (bVar2) {
      pcVar7 = "yes";
    }
    Abc_Print(-2,"\t-p       : toggles deriving edges from packing [default = %s]\n",pcVar7);
    pcVar7 = "no";
    if (bVar3) {
      pcVar7 = "yes";
    }
    Abc_Print(-2,"\t-o       : toggles using old algorithm [default = %s]\n",pcVar7);
    pcVar7 = "no";
    if (bVar1) {
      pcVar7 = "yes";
    }
    Abc_Print(-2,"\t-m       : toggles combining edge assignment with mapping [default = %s]\n",
              pcVar7);
    pcVar7 = "no";
    if (local_50 != 0) {
      pcVar7 = "yes";
    }
    Abc_Print(-2,"\t-d       : toggles dynamic addition of clauses [default = %s]\n",pcVar7);
    pcVar7 = "no";
    if (local_54 != 0) {
      pcVar7 = "yes";
    }
    Abc_Print(-2,"\t-v       : toggles verbose output [default = %s]\n",pcVar7);
    Abc_Print(-2,"\t-h       : prints the command usage\n");
    return 1;
  }
  goto LAB_002b5450;
}

Assistant:

int Abc_CommandAbc9Edge( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Edg_ManAssignEdgeNew( Gia_Man_t * p, int nEdges, int fVerbose );
    extern void Seg_ManComputeDelay( Gia_Man_t * pGia, int Delay, int nFanouts, int fTwo, int fVerbose );
    extern void Sle_ManExplore( Gia_Man_t * pGia, int nBTLimit, int DelayInit, int fDynamic, int fTwoEdges, int fVerbose );

    int c, nBTLimit = 0, DelayMax = 0, nFanouts = 0, nEdges = 1, fReverse = 0, fUsePack = 0, fUseOld = 0, fMapping = 0, fDynamic = 1, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CDFErpomdvh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'C':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-C\" should be followed by a positive integer.\n" );
                    goto usage;
                }
                nBTLimit = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                break;
            case 'D':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-D\" should be followed by a positive integer.\n" );
                    goto usage;
                }
                DelayMax = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                break;
            case 'F':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-F\" should be followed by a positive integer.\n" );
                    goto usage;
                }
                nFanouts = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                break;
            case 'E':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-E\" should be followed by a positive integer.\n" );
                    goto usage;
                }
                nEdges = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nEdges != 1 && nEdges != 2 )
                {
                    Abc_Print( -1, "Edge limit (%d) should be 1 or 2.\n", nEdges );
                    goto usage;
                }
                break;
            case 'r':
                fReverse ^= 1;
                break;
            case 'p':
                fUsePack ^= 1;
                break;
            case 'o':
                fUseOld ^= 1;
                break;
            case 'm':
                fMapping ^= 1;
                break;
            case 'd':
                fDynamic ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
            default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty GIA network.\n" );
        return 1;
    }
    if ( fMapping )
    {
        Sle_ManExplore( pAbc->pGia, nBTLimit, DelayMax, fDynamic, nEdges==2, fVerbose );
        return 0;
    }
    if ( !Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "Current AIG has no mapping. Run \"&if\".\n" );
        return 1;
    }
    if ( Gia_ManLutSizeMax(pAbc->pGia) > 6 )
    {
        Abc_Print( 0, "Current AIG has mapping into %d-LUTs.\n", Gia_ManLutSizeMax(pAbc->pGia) );
        return 0;
    }
    if ( fUsePack )
    {
        if ( pAbc->pGia->vPacking == NULL )
        {
            Abc_Print( -1, "Packing information is not present.\n" );
            return 0;
        }
        Gia_ManConvertPackingToEdges( pAbc->pGia );
        return 0;
    }
    if ( !fUseOld )
    {
        //Edg_ManAssignEdgeNew( pAbc->pGia, nEdges, fVerbose );
        Seg_ManComputeDelay( pAbc->pGia, DelayMax, nFanouts, nEdges==2, fVerbose );
        return 0;
    }
    if ( pAbc->pGia->pManTime && fReverse )
    {
        Abc_Print( 0, "Reverse computation does not work when boxes are present.\n" );
        return 0;
    }
    if ( fReverse )
        DelayMax = Gia_ManComputeEdgeDelay2( pAbc->pGia );
    else
        DelayMax = Gia_ManComputeEdgeDelay( pAbc->pGia, nEdges == 2 );
    //printf( "The number of edges = %d.  Delay = %d.\n", Gia_ManEvalEdgeCount(pAbc->pGia), DelayMax );
    return 0;

usage:
    Abc_Print( -2, "usage: &edge [-CDFE num] [-rpomdvh]\n" );
    Abc_Print( -2, "\t           find edge assignment of the LUT-mapped network\n" );
    Abc_Print( -2, "\t-C num   : the SAT solver conflict limit (0 = unused) [default = %d]\n", nBTLimit );
    Abc_Print( -2, "\t-D num   : the upper bound on delay [default = %d]\n", DelayMax );
    Abc_Print( -2, "\t-F num   : skip using edge if fanout higher than this [default = %d]\n", nFanouts );
    Abc_Print( -2, "\t-E num   : the limit on the number of edges (1 <= num <= 2) [default = %d]\n", nEdges );
    Abc_Print( -2, "\t-r       : toggles using reverse order [default = %s]\n", fReverse? "yes": "no" );
    Abc_Print( -2, "\t-p       : toggles deriving edges from packing [default = %s]\n", fUsePack? "yes": "no" );
    Abc_Print( -2, "\t-o       : toggles using old algorithm [default = %s]\n", fUseOld? "yes": "no" );
    Abc_Print( -2, "\t-m       : toggles combining edge assignment with mapping [default = %s]\n", fMapping? "yes": "no" );
    Abc_Print( -2, "\t-d       : toggles dynamic addition of clauses [default = %s]\n", fDynamic? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : prints the command usage\n");
    return 1;
}